

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall Printer::~Printer(Printer *this)

{
  long lVar1;
  
  if (0 < this->attrCount) {
    lVar1 = 0;
    do {
      if (this->psHeader[lVar1] != (char *)0x0) {
        operator_delete__(this->psHeader[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->attrCount);
  }
  if (this->spaces != (int *)0x0) {
    operator_delete__(this->spaces);
  }
  free(this->psHeader);
  if (this->attributes != (DataAttrInfo *)0x0) {
    operator_delete__(this->attributes);
    return;
  }
  return;
}

Assistant:

Printer::~Printer()
{
    for (int i = 0; i < attrCount; i++)
        delete [] psHeader[i];

    delete [] spaces;
    //delete [] psHeader;
    free (psHeader);
    delete [] attributes;
}